

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

double __thiscall
anon_unknown.dwarf_1e376::sampleY<Imath_3_2::half>
          (anon_unknown_dwarf_1e376 *this,TypedImageChannel<Imath_3_2::half> *channel,int h,int x,
          double y,Extrapolation ext)

{
  uint x_00;
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ushort *puVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  if (0.0 <= y) {
    uVar6 = (uint)y;
  }
  else {
    dVar7 = -y;
    uVar6 = -((uint)((double)(int)dVar7 < dVar7) + (int)dVar7);
  }
  x_00 = uVar6 + 1;
  switch(ext) {
  case BLACK:
    dVar8 = 0.0;
    dVar7 = 0.0;
    if ((int)uVar6 < h && -1 < (int)uVar6) {
      dVar7 = (double)*(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)
                                        ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                        (long)x * 2 + (ulong)uVar6 * (long)this * 2) * 4);
    }
    if (h <= (int)x_00 || (int)uVar6 < -1) goto LAB_00109d76;
    puVar5 = (ushort *)
             ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
             (long)x * 2 + (ulong)x_00 * (long)this * 2);
    break;
  case CLAMP:
    uVar3 = h - 1;
    uVar4 = uVar3;
    if ((int)uVar6 < (int)uVar3) {
      uVar4 = uVar6;
    }
    if ((int)uVar6 < 0) {
      uVar4 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)uVar6 < -1) {
      uVar3 = 0;
    }
    fVar1 = *(float *)(_imath_half_to_float_table +
                      (ulong)*(ushort *)
                              ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                              (long)x * 2 + (long)(int)uVar4 * (long)this * 2) * 4);
    goto LAB_00109cc2;
  case PERIODIC:
    if ((int)uVar6 < 0) {
      if (-1 < h) {
        uVar3 = ((~uVar6 + h) - (~uVar6 + h) % (uint)h) + uVar6;
        if (uVar6 != 0xffffffff) {
          uVar6 = ((h - uVar6) - 2) / (uint)h;
          goto LAB_00109d2e;
        }
        goto LAB_00109c28;
      }
      uVar3 = uVar6 - ((~h - uVar6) / (uint)-h) * h;
      if (uVar6 == 0xffffffff) goto LAB_00109d27;
      uVar6 = (~h - x_00) / (uint)-h;
    }
    else if (h < 0) {
      uVar3 = uVar6 + (uVar6 / (uint)-h) * h;
LAB_00109d27:
      uVar6 = x_00 / (uint)-h;
LAB_00109d2e:
      uVar6 = -uVar6;
    }
    else {
      uVar3 = uVar6 % (uint)h;
LAB_00109c28:
      uVar6 = x_00 / (uint)h;
    }
    dVar7 = (double)*(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)
                                      ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                      (long)x * 2 + (long)(int)uVar3 * (long)this * 2) * 4);
    puVar5 = (ushort *)
             ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
             (long)x * 2 + (long)(int)(x_00 - uVar6 * h) * (long)this * 2);
    break;
  case MIRROR:
    iVar2 = mirror(uVar6,h);
    uVar3 = mirror(x_00,h);
    fVar1 = *(float *)(_imath_half_to_float_table +
                      (ulong)*(ushort *)
                              ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                              (long)x * 2 + (long)iVar2 * (long)this * 2) * 4);
LAB_00109cc2:
    dVar7 = (double)fVar1;
    puVar5 = (ushort *)
             ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
             (long)x * 2 + (long)(int)uVar3 * (long)this * 2);
    break;
  default:
    dVar7 = 0.0;
    dVar8 = 0.0;
    goto LAB_00109d76;
  }
  dVar8 = (double)*(float *)(_imath_half_to_float_table + (ulong)*puVar5 * 4);
LAB_00109d76:
  return ((double)(int)x_00 - y) * dVar7 + (1.0 - ((double)(int)x_00 - y)) * dVar8;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}